

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

void __thiscall
duckdb::BoundLambdaRefExpression::Serialize(BoundLambdaRefExpression *this,Serializer *serializer)

{
  Expression::Serialize(&this->super_Expression,serializer);
  Serializer::WriteProperty<duckdb::LogicalType>
            (serializer,200,"return_type",&(this->super_Expression).return_type);
  Serializer::WriteProperty<duckdb::ColumnBinding>(serializer,0xc9,"binding",&this->binding);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0xca,"lambda_index",&this->lambda_idx);
  Serializer::WritePropertyWithDefault<unsigned_long>(serializer,0xcb,"depth",&this->depth);
  return;
}

Assistant:

void BoundLambdaRefExpression::Serialize(Serializer &serializer) const {
	Expression::Serialize(serializer);
	serializer.WriteProperty<LogicalType>(200, "return_type", return_type);
	serializer.WriteProperty<ColumnBinding>(201, "binding", binding);
	serializer.WritePropertyWithDefault<idx_t>(202, "lambda_index", lambda_idx);
	serializer.WritePropertyWithDefault<idx_t>(203, "depth", depth);
}